

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O0

string * __thiscall
JointPolicyPureVectorForClusteredBG::SoftPrint_abi_cxx11_(JointPolicyPureVectorForClusteredBG *this)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  Index last_ts;
  ostream *poVar4;
  size_t sVar5;
  void *this_00;
  Interface_ProblemToPolicyDiscretePure *pIVar6;
  undefined8 uVar7;
  type this_01;
  reference ppJVar8;
  type pJVar9;
  JointPolicyPureVectorForClusteredBG *in_RSI;
  string *in_RDI;
  shared_ptr<const_PartialJointPolicyDiscretePure> sVar10;
  shared_ptr<const_JointPolicyDiscretePure> jp;
  Index t_inv;
  Index t;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  bgVec;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  jpolBGVec;
  shared_ptr<const_BayesianGameWithClusterInfo> bg;
  JointPolicyPureVectorForClusteredBG *jpolBG;
  size_t h;
  PlanningUnitDecPOMDPDiscrete *pu;
  stringstream ss;
  size_t depth;
  JointPolicyPureVectorForClusteredBG *in_stack_fffffffffffffc28;
  shared_ptr<const_JointPolicyDiscretePure> *in_stack_fffffffffffffc30;
  shared_ptr<const_BayesianGameWithClusterInfo> *in_stack_fffffffffffffc38;
  PlanningUnitDecPOMDPDiscrete *pu_00;
  undefined4 in_stack_fffffffffffffc40;
  Index ts;
  undefined4 in_stack_fffffffffffffc44;
  JointPolicyDiscretePure *in_stack_fffffffffffffc48;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  E *in_stack_fffffffffffffc60;
  ostream *in_stack_fffffffffffffc78;
  ostream *in_stack_fffffffffffffc80;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  local_2b0;
  string local_298 [40];
  undefined1 local_270 [16];
  shared_ptr<const_JointPolicyDiscretePure> local_260;
  shared_ptr<const_JointPolicyPureVectorForClusteredBG> local_250 [2];
  uint local_22c;
  Index local_228;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  local_200;
  shared_ptr<const_BayesianGameWithClusterInfo> local_1e8;
  element_type *local_1d8;
  size_t local_1d0;
  PlanningUnitDecPOMDPDiscrete *local_1c8;
  undefined4 local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  size_t local_18;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"JointPolicyPureVectorForClusteredBG:SoftPrint");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_18 = JointPolicy::GetDepth((JointPolicy *)in_RSI);
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar4 = std::operator<<(local_190,"JointPolicyPureVectorForClusteredBG, depth ");
  sVar5 = JointPolicy::GetDepth((JointPolicy *)in_RSI);
  this_00 = (void *)std::ostream::operator<<(poVar4,sVar5);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  if (local_18 == 0) {
    poVar4 = std::operator<<(local_190,"empty policy!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::str();
    local_1b0 = 1;
  }
  else {
    JointPolicyDiscretePure::GetInterfacePTPDiscretePureShared(in_stack_fffffffffffffc48);
    bVar2 = boost::operator==((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)
                              in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    bVar3 = false;
    if (bVar2) {
      pIVar6 = JointPolicyDiscretePure::GetInterfacePTPDiscretePure
                         ((JointPolicyDiscretePure *)
                          CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
      bVar3 = pIVar6 == (Interface_ProblemToPolicyDiscretePure *)0x0;
    }
    boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x8c9329);
    if (bVar3) {
      uVar7 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      __cxa_throw(uVar7,&E::typeinfo,E::~E);
    }
    poVar4 = std::operator<<(local_190,
                             "Improve printing this (clustered) policy..., the below still takes exponential space... "
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_01 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&in_RSI->_m_bg);
    local_1c8 = BayesianGameForDecPOMDPStage::GetPUDecPOMDPDiscrete
                          (&this_01->super_BayesianGameForDecPOMDPStage);
    local_1d0 = JointPolicy::GetDepth((JointPolicy *)in_RSI);
    local_1d8 = in_RSI;
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8c9488);
    std::allocator<const_JointPolicyDiscretePure_*>::allocator
              ((allocator<const_JointPolicyDiscretePure_*> *)0x8c94ad);
    std::vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>::
    vector((vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
            *)in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
    std::allocator<const_JointPolicyDiscretePure_*>::~allocator
              ((allocator<const_JointPolicyDiscretePure_*> *)0x8c94d9);
    std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>::allocator
              ((allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_> *)0x8c94fe);
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::vector(in_stack_fffffffffffffc50,(size_type)in_stack_fffffffffffffc48,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
    std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>::~allocator
              ((allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_> *)0x8c952a);
    local_228 = 0;
    for (local_22c = 0; local_22c < local_1d0; local_22c = local_22c + 1) {
      local_228 = ~local_22c + (int)local_1d0;
      GetBG(in_stack_fffffffffffffc28);
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=
                ((shared_ptr<const_BayesianGameWithClusterInfo> *)
                 CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                 in_stack_fffffffffffffc38);
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
                ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8c95a9);
      peVar1 = local_1d8;
      ppJVar8 = std::
                vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                ::at((vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                      *)in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
      *ppJVar8 = (value_type)peVar1;
      std::
      vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
      ::at((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
            *)in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=
                ((shared_ptr<const_BayesianGameWithClusterInfo> *)
                 CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                 in_stack_fffffffffffffc38);
      if (local_228 != 0) {
        GetPrevJPPVfCBG(in_stack_fffffffffffffc28);
        local_1d8 = boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::get(local_250);
        boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::~shared_ptr
                  ((shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)0x8c9662);
        if (local_1d8 == (element_type *)0x0) {
          boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&local_1e8);
          sVar10 = BayesianGameForDecPOMDPStageInterface::GetPastJointPolicy
                             ((BayesianGameForDecPOMDPStageInterface *)in_stack_fffffffffffffc28);
          boost::shared_ptr<JointPolicyDiscretePure_const>::
          shared_ptr<PartialJointPolicyDiscretePure_const>(&local_260,local_270,sVar10.pn.pi_.pi_);
          boost::shared_ptr<const_PartialJointPolicyDiscretePure>::~shared_ptr
                    ((shared_ptr<const_PartialJointPolicyDiscretePure> *)0x8c96bb);
          bVar3 = boost::operator!=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          if (bVar3) {
            poVar4 = std::operator<<(local_190,"The following joint policy was used for stages 0..."
                                    );
            in_stack_fffffffffffffc80 = (ostream *)std::ostream::operator<<(poVar4,local_228);
            in_stack_fffffffffffffc78 = std::operator<<(in_stack_fffffffffffffc80," :");
            std::ostream::operator<<
                      (in_stack_fffffffffffffc78,std::endl<char,std::char_traits<char>>);
            pJVar9 = boost::shared_ptr<const_JointPolicyDiscretePure>::operator->(&local_260);
            (*(pJVar9->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[6])(local_298)
            ;
            std::operator<<(local_190,local_298);
            std::__cxx11::string::~string(local_298);
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cerr,
                                     "JointPolicyPureVectorForClusteredBG::SoftPrint");
            poVar4 = std::operator<<(poVar4," t=");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_228);
            poVar4 = std::operator<<(poVar4,", but no past joint policy? (jp ==0)");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          }
          local_1b0 = 2;
          boost::shared_ptr<const_JointPolicyDiscretePure>::~shared_ptr
                    ((shared_ptr<const_JointPolicyDiscretePure> *)0x8c98c5);
          break;
        }
      }
    }
    last_ts = (int)local_1d0 - 1;
    pu_00 = local_1c8;
    ts = local_228;
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::vector((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
              *)in_stack_fffffffffffffc80,
             (vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
              *)in_stack_fffffffffffffc78);
    StartRecursiveSoftPrintPerAgent
              (in_RSI,pu_00,(stringstream *)local_1a0,ts,last_ts,&local_200,&local_2b0);
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::~vector((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
               *)CONCAT44(last_ts,ts));
    std::__cxx11::stringstream::str();
    local_1b0 = 1;
    std::
    vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
    ::~vector((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
               *)CONCAT44(last_ts,ts));
    std::vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>::
    ~vector((vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
             *)CONCAT44(last_ts,ts));
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8c99c0);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

string JointPolicyPureVectorForClusteredBG::SoftPrint() const
{
    cout << "JointPolicyPureVectorForClusteredBG:SoftPrint"<<endl;
    size_t depth = GetDepth();
    stringstream ss;
    ss << "JointPolicyPureVectorForClusteredBG, depth " 
       << GetDepth() << endl;
    if(depth == 0)
    {
        ss << "empty policy!"<< endl;
        return(ss.str());
    }

    if(JointPolicyDiscretePure::GetInterfacePTPDiscretePureShared() == 0 &&
       JointPolicyDiscretePure::GetInterfacePTPDiscretePure() == 0)
        throw E("JointPolicyPureVectorForClusteredBG:SoftPrint - Error!!! PTPDP==0, but depth>0");
            
    ss << "Improve printing this (clustered) policy..., the below still takes exponential space... "<<endl;
/*    for(
            Index agentI = 0; 
            agentI <    static_cast< vector<PolicyPureVector*>::size_type> 
                            (PTPDP->GetNrAgents());
            agentI++
        )
    {
        ss << "Policy for agent " << agentI << " (index "
           << _m_policyPointerVector.at(agentI)->GetIndex() << "):" << endl
           << _m_policyPointerVector.at(agentI)->SoftPrint();
    }
*/    
    const PlanningUnitDecPOMDPDiscrete* pu = _m_bg->GetPUDecPOMDPDiscrete();
    size_t h = this->GetDepth();//pu->GetHorizon();
//     JPPVfCBG_constPtr jpolBG = 
//         JPPVfCBG_constPtr(new JointPolicyPureVectorForClusteredBG(*this));
    const JointPolicyPureVectorForClusteredBG *jpolBG=this;
    boost::shared_ptr<const BayesianGameWithClusterInfo> bg;
    vector<const JointPolicyDiscretePure* > jpolBGVec(h);
    vector<boost::shared_ptr<const BayesianGameWithClusterInfo> > bgVec(h);
    Index t=0;
    //for(t=h-1; t >= 0; t--) //<- this never terminates (t is unsigned)
    for(Index t_inv = 0; t_inv < h; t_inv++)
    {
        t = h - 1 - t_inv;
        bg =  jpolBG->GetBG();
        jpolBGVec.at(t) = jpolBG;
        bgVec.at(t) = bg;

        if( t > 0  )
        {
            jpolBG = jpolBG->GetPrevJPPVfCBG().get();
            if(jpolBG == 0)
            {
                //apparently for stages 0...t a different type of policy is used
                //we get it from the BG:
                boost::shared_ptr<const JointPolicyDiscretePure> jp = bg->GetPastJointPolicy();
                if(jp != 0)
                {
                    ss << "The following joint policy was used for stages 0..."
                        << t << " :"<< endl;
                    ss << jp->SoftPrint();
                }
                else
                {
                    cerr << "JointPolicyPureVectorForClusteredBG::SoftPrint"
                       <<" t="<<t<<", but no past joint policy? (jp ==0)"<<endl;

                }
                break;
            }

        }
    }
#if DEBUG_RECURSIVE_SPRINT
    cout << ">>>About to start StartRecursiveSoftPrintPerAgent..."<<endl;
#endif
    StartRecursiveSoftPrintPerAgent(pu, ss, t, h-1, jpolBGVec, bgVec);
    return(ss.str());
}